

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall gui::Group::handleMouseMove(Group *this)

{
  Vector2f *in_stack_00000020;
  Group *in_stack_00000028;
  
  handleMouseMove(in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

bool Group::handleMouseMove(const sf::Vector2f& mouseParent) {
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget == nullptr || !widget->handleMouseMove(mouseLocal)) {
        return baseClass::handleMouseMove(mouseParent);
    } else {
        return true;
    }
}